

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O3

QString * __thiscall
QJsonParseError::errorString(QString *__return_storage_ptr__,QJsonParseError *this)

{
  DataPointer *pDVar1;
  storage_type *in_RCX;
  char *pcVar2;
  QString *this_00;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((ulong)this->error < 0xf) {
    in_RCX = &DAT_00182c3c;
    pcVar2 = &DAT_00182c3c + *(int *)(&DAT_00182c3c + (ulong)this->error * 4);
  }
  else {
    pcVar2 = "";
  }
  this_00 = (QString *)0xffffffffffffffff;
  do {
    pDVar1 = &this_00->d;
    this_00 = (QString *)((long)&(this_00->d).d + 1);
  } while ((pcVar2 + 1)[(long)&pDVar1->d] != '\0');
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)pcVar2;
  QString::fromLatin1(&local_38,this_00,ba);
  *(undefined4 *)&(__return_storage_ptr__->d).d = local_38.d.d._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_38.d.d._4_4_;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_38.d.ptr._0_4_;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_38.d.ptr._4_4_;
  (__return_storage_ptr__->d).size = local_38.d.size;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QJsonParseError::errorString() const
{
    const char *sz = "";
    switch (error) {
    case NoError:
        sz = JSONERR_OK;
        break;
    case UnterminatedObject:
        sz = JSONERR_UNTERM_OBJ;
        break;
    case MissingNameSeparator:
        sz = JSONERR_MISS_NSEP;
        break;
    case UnterminatedArray:
        sz = JSONERR_UNTERM_AR;
        break;
    case MissingValueSeparator:
        sz = JSONERR_MISS_VSEP;
        break;
    case IllegalValue:
        sz = JSONERR_ILLEGAL_VAL;
        break;
    case TerminationByNumber:
        sz = JSONERR_END_OF_NUM;
        break;
    case IllegalNumber:
        sz = JSONERR_ILLEGAL_NUM;
        break;
    case IllegalEscapeSequence:
        sz = JSONERR_STR_ESC_SEQ;
        break;
    case IllegalUTF8String:
        sz = JSONERR_STR_UTF8;
        break;
    case UnterminatedString:
        sz = JSONERR_UTERM_STR;
        break;
    case MissingObject:
        sz = JSONERR_MISS_OBJ;
        break;
    case DeepNesting:
        sz = JSONERR_DEEP_NEST;
        break;
    case DocumentTooLarge:
        sz = JSONERR_DOC_LARGE;
        break;
    case GarbageAtEnd:
        sz = JSONERR_GARBAGEEND;
        break;
    }
#ifndef QT_BOOTSTRAPPED
    return QCoreApplication::translate("QJsonParseError", sz);
#else
    return QLatin1StringView(sz);
#endif
}